

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::FocusWindow(ImGuiWindow *window)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  ImGuiWindow **ppIVar4;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiWindow **__dest;
  int iVar7;
  size_t __n;
  int iVar8;
  long lVar9;
  ImGuiContext *g;
  ImGuiWindow *pIVar10;
  
  pIVar5 = GImGui;
  GImGui->FocusedWindow = window;
  if (window != (ImGuiWindow *)0x0) {
    pIVar10 = window->RootWindow;
    if (window->RootWindow == (ImGuiWindow *)0x0) {
      pIVar10 = window;
    }
    uVar2 = pIVar10->Flags;
    if (((((uVar2 >> 0x19 & 1) != 0) && (pIVar5->ActiveId != 0)) &&
        (pIVar5->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
       (pIVar5->ActiveIdWindow->RootWindow != pIVar10)) {
      pIVar5->ActiveId = 0;
      pIVar5->ActiveIdIsJustActivated = true;
      pIVar5->ActiveIdAllowOverlap = false;
      pIVar5->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
    if ((uVar2 >> 0xd & 1) == 0) {
      uVar2 = (pIVar5->Windows).Size;
      if ((long)(int)uVar2 < 1) {
        __assert_fail("Size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                      ,0x35d,"value_type &ImVector<ImGuiWindow *>::back() [T = ImGuiWindow *]");
      }
      ppIVar4 = (pIVar5->Windows).Data;
      if (ppIVar4[(long)(int)uVar2 + -1] != pIVar10) {
        __n = (ulong)uVar2 * 8 - 8;
        lVar9 = 0;
        do {
          if (ppIVar4[lVar9] == pIVar10) {
            if (uVar2 <= (uint)lVar9) {
              __assert_fail("it >= Data && it < Data+Size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                            ,0x372,
                            "iterator ImVector<ImGuiWindow *>::erase(const_iterator) [T = ImGuiWindow *]"
                           );
            }
            memmove(ppIVar4 + lVar9,ppIVar4 + lVar9 + 1,__n);
            (pIVar5->Windows).Size = (pIVar5->Windows).Size + -1;
            break;
          }
          lVar9 = lVar9 + 1;
          __n = __n - 8;
        } while (__n != 0xfffffffffffffff8);
        pIVar6 = GImGui;
        iVar8 = (pIVar5->Windows).Size;
        iVar3 = (pIVar5->Windows).Capacity;
        if (iVar8 == iVar3) {
          iVar8 = iVar8 + 1;
          if (iVar3 == 0) {
            iVar7 = 8;
          }
          else {
            iVar7 = iVar3 / 2 + iVar3;
          }
          if (iVar8 < iVar7) {
            iVar8 = iVar7;
          }
          if (iVar3 < iVar8) {
            piVar1 = &(GImGui->IO).MetricsAllocs;
            *piVar1 = *piVar1 + 1;
            __dest = (ImGuiWindow **)(*(pIVar6->IO).MemAllocFn)((long)iVar8 << 3);
            ppIVar4 = (pIVar5->Windows).Data;
            if (ppIVar4 != (ImGuiWindow **)0x0) {
              memcpy(__dest,ppIVar4,(long)(pIVar5->Windows).Size << 3);
            }
            ppIVar4 = (pIVar5->Windows).Data;
            if (ppIVar4 != (ImGuiWindow **)0x0) {
              piVar1 = &(GImGui->IO).MetricsAllocs;
              *piVar1 = *piVar1 + -1;
            }
            (*(GImGui->IO).MemFreeFn)(ppIVar4);
            (pIVar5->Windows).Data = __dest;
            (pIVar5->Windows).Capacity = iVar8;
          }
        }
        iVar8 = (pIVar5->Windows).Size;
        (pIVar5->Windows).Size = iVar8 + 1;
        (pIVar5->Windows).Data[iVar8] = pIVar10;
      }
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    // Always mark the window we passed as focused. This is used for keyboard interactions such as tabbing.
    g.FocusedWindow = window;

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // And move its root window to the top of the pile
    if (window->RootWindow)
        window = window->RootWindow;

    // Steal focus on active widgets
    if (window->Flags & ImGuiWindowFlags_Popup) // FIXME: This statement should be unnecessary. Need further testing before removing it..
        if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != window)
            SetActiveID(0);

    // Bring to front
    if ((window->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus) || g.Windows.back() == window)
        return;
    for (int i = 0; i < g.Windows.Size; i++)
        if (g.Windows[i] == window)
        {
            g.Windows.erase(g.Windows.begin() + i);
            break;
        }
    g.Windows.push_back(window);
}